

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_slb_add_backend_servers.cc
# Opt level: O2

int __thiscall
aliyun::Slb::AddBackendServers
          (Slb *this,SlbAddBackendServersRequestType *req,SlbAddBackendServersResponseType *response
          ,SlbErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  Value *this_01;
  uint index;
  char *pcVar6;
  allocator<char> local_414;
  allocator<char> local_413;
  allocator<char> local_412;
  allocator<char> local_411;
  Value val;
  value_type local_3f8;
  SlbAddBackendServersResponseType *local_3d0;
  uint local_3c4;
  string str_response;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if (this->use_tls_ != false) {
    pcVar6 = "https";
  }
  local_3d0 = response;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar6,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_3f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar6,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_3f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"AddBackendServers",(allocator<char> *)&local_3a0);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->load_balancer_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"LoadBalancerId",(allocator<char> *)&local_3f8);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->backend_servers)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"BackendServers",(allocator<char> *)&local_3f8);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->backend_servers);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->host_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"HostId",(allocator<char> *)&local_3f8);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->host_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"OwnerAccount",(allocator<char> *)&local_3f8);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"RegionId",(allocator<char> *)&local_3f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,this->region_id_,(allocator<char> *)&local_3a0);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (SlbErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_3f8.server_id,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f8,anon_var_dwarf_f22a4 + 9,&local_411);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_3f8.server_id,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f8,anon_var_dwarf_f22a4 + 9,&local_412);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_3f8.server_id,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f8,anon_var_dwarf_f22a4 + 9,&local_413);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_3f8.server_id,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f8,anon_var_dwarf_f22a4 + 9,&local_414);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
      }
      if (local_3d0 != (SlbAddBackendServersResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"LoadBalancerId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"LoadBalancerId");
          Json::Value::asString_abi_cxx11_(&local_3f8.server_id,pVVar4);
          std::__cxx11::string::operator=
                    ((string *)&local_3d0->load_balancer_id,(string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_3f8);
        }
        bVar1 = Json::Value::isMember(&val,"BackendServers");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"BackendServers");
          bVar1 = Json::Value::isMember(pVVar4,"BackendServer");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"BackendServers");
            pVVar4 = Json::Value::operator[](pVVar4,"BackendServer");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              for (index = 0; AVar3 = Json::Value::size(pVVar4), index < AVar3; index = index + 1) {
                local_3f8.server_id._M_dataplus._M_p = (pointer)&local_3f8.server_id.field_2;
                local_3f8.server_id._M_string_length = 0;
                local_3f8.server_id.field_2._M_local_buf[0] = '\0';
                pVVar5 = Json::Value::operator[](pVVar4,index);
                bVar1 = Json::Value::isMember(pVVar5,"ServerId");
                if (bVar1) {
                  this_01 = Json::Value::operator[](pVVar5,"ServerId");
                  Json::Value::asString_abi_cxx11_(&local_3a0,this_01);
                  local_3c4 = index;
                  std::__cxx11::string::operator=((string *)&local_3f8,(string *)&local_3a0);
                  index = local_3c4;
                  std::__cxx11::string::~string((string *)&local_3a0);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Weight");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar5,"Weight");
                  local_3f8.weight = Json::Value::asInt(pVVar5);
                }
                std::
                vector<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                ::push_back(&local_3d0->backend_servers,&local_3f8);
                std::__cxx11::string::~string((string *)&local_3f8);
              }
            }
          }
        }
      }
      goto LAB_0012c678;
    }
  }
  iVar2 = -1;
  if (error_info != (SlbErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0012c678:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Slb::AddBackendServers(const SlbAddBackendServersRequestType& req,
                      SlbAddBackendServersResponseType* response,
                       SlbErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","AddBackendServers");
  if(!req.load_balancer_id.empty()) {
    req_rpc->AddRequestQuery("LoadBalancerId", req.load_balancer_id);
  }
  if(!req.backend_servers.empty()) {
    req_rpc->AddRequestQuery("BackendServers", req.backend_servers);
  }
  if(!req.host_id.empty()) {
    req_rpc->AddRequestQuery("HostId", req.host_id);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}